

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O0

Formula * __thiscall Kernel::FormulaTransformer::applyNot(FormulaTransformer *this,Formula *f)

{
  Connective CVar1;
  Formula *this_00;
  Formula *pFVar2;
  Formula *in_RSI;
  NegatedFormula *in_RDI;
  Formula *unaff_retaddr;
  FormulaTransformer *in_stack_00000008;
  Formula *newArg;
  undefined8 local_8;
  
  Formula::uarg((Formula *)0x858d02);
  this_00 = apply(in_stack_00000008,unaff_retaddr);
  pFVar2 = Formula::uarg((Formula *)0x858d28);
  local_8 = in_RSI;
  if (this_00 != pFVar2) {
    CVar1 = Formula::connective(this_00);
    if (CVar1 == NOT) {
      local_8 = Formula::uarg((Formula *)0x858d5a);
    }
    else {
      local_8 = (Formula *)NegatedFormula::operator_new(0x858d6b);
      NegatedFormula::NegatedFormula(in_RDI,local_8);
    }
  }
  return local_8;
}

Assistant:

Formula* FormulaTransformer::applyNot(Formula* f)
{
  Formula* newArg = apply(f->uarg());
  if(newArg==f->uarg()) {
    return f;
  }
  if(newArg->connective()==NOT) {
    return newArg->uarg();
  }
  return new NegatedFormula(newArg);
}